

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O2

int png_image_read_composite(png_voidp argument)

{
  int iVar1;
  uint uVar2;
  undefined8 *puVar3;
  png_const_structrp png_ptr;
  long lVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  png_bytep row;
  uint local_7c;
  uint local_78;
  ulong local_50;
  
  puVar3 = *argument;
  png_ptr = *(png_const_structrp *)*puVar3;
  local_7c = 1;
  if (png_ptr->interlaced != '\0') {
    if (png_ptr->interlaced != '\x01') {
      png_error(png_ptr,"unknown interlace type");
    }
    local_7c = 7;
  }
  iVar1 = *(int *)((long)puVar3 + 0xc);
  uVar2 = *(uint *)(puVar3 + 2);
  lVar4 = *(long *)((long)argument + 0x38);
  uVar8 = *(uint *)((long)puVar3 + 0x14) & 2;
  uVar10 = (ulong)uVar8 + 1;
  iVar9 = (int)uVar10;
  uVar16 = 0;
LAB_0027dbb3:
  uVar11 = uVar16;
  if (uVar11 == local_7c) {
    return 1;
  }
  if (png_ptr->interlaced == '\x01') goto code_r0x0027dbd2;
  local_50 = 0;
  local_78 = 1;
  uVar16 = 0;
  uVar17 = uVar10;
  goto LAB_0027dd4a;
code_r0x0027dbd2:
  bVar13 = (byte)(7 - uVar11 >> 1);
  bVar7 = 3;
  if (1 < uVar11) {
    bVar7 = bVar13;
  }
  uVar14 = (uVar11 & 1) << (3U - (char)(uVar11 + 1 >> 1) & 0x1f) & 7;
  uVar16 = uVar11 + 1;
  if ((~(-1 << (bVar7 & 0x1f)) + iVar1) - uVar14 >> (bVar7 & 0x1f) != 0) {
    uVar17 = (ulong)(uint)(iVar9 << (bVar13 & 0x1f));
    local_50 = (ulong)(uVar14 * iVar9);
    local_78 = 8 >> ((byte)(uVar11 - 1 >> 1) & 0x1f);
    uVar16 = (uVar11 & 1 ^ 1) << (3U - (char)(uVar11 >> 1) & 0x1f) & 7;
    if (uVar11 < 3) {
      local_78 = 8;
    }
LAB_0027dd4a:
    for (; uVar16 < uVar2; uVar16 = uVar16 + local_78) {
      row = *(png_bytep *)((long)argument + 0x28);
      png_read_row(png_ptr,row,(png_bytep)0x0);
      lVar5 = (ulong)uVar16 * lVar4 + *(long *)((long)argument + 0x30);
      for (uVar6 = lVar5 + local_50; uVar6 < (ulong)(uint)(iVar9 * iVar1) + lVar5;
          uVar6 = uVar6 + uVar17) {
        bVar7 = row[uVar10];
        if (bVar7 != 0) {
          for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
            bVar13 = row[uVar12];
            if (bVar7 != 0xff) {
              uVar15 = (uint)png_sRGB_table[*(byte *)(uVar6 + uVar12)] * (uint)(byte)~bVar7 +
                       (uint)bVar13 * 0xffff;
              uVar14 = uVar15 >> 0xf;
              bVar13 = (byte)(((uint)png_sRGB_delta[uVar14] * (uVar15 & 0x7fff) >> 0xc) +
                              (uint)png_sRGB_base[uVar14] >> 8);
            }
            *(byte *)(uVar6 + uVar12) = bVar13;
          }
        }
        row = row + (uVar8 + 2);
      }
    }
    uVar16 = uVar11 + 1;
  }
  goto LAB_0027dbb3;
}

Assistant:

static int
png_image_read_composite(png_voidp argument)
{
   png_image_read_control *display = png_voidcast(png_image_read_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;
   int passes;

   switch (png_ptr->interlaced)
   {
      case PNG_INTERLACE_NONE:
         passes = 1;
         break;

      case PNG_INTERLACE_ADAM7:
         passes = PNG_INTERLACE_ADAM7_PASSES;
         break;

      default:
         png_error(png_ptr, "unknown interlace type");
   }

   {
      png_uint_32  height = image->height;
      png_uint_32  width = image->width;
      ptrdiff_t    step_row = display->row_bytes;
      unsigned int channels =
          (image->format & PNG_FORMAT_FLAG_COLOR) != 0 ? 3 : 1;
      int pass;

      for (pass = 0; pass < passes; ++pass)
      {
         unsigned int     startx, stepx, stepy;
         png_uint_32      y;

         if (png_ptr->interlaced == PNG_INTERLACE_ADAM7)
         {
            /* The row may be empty for a short image: */
            if (PNG_PASS_COLS(width, pass) == 0)
               continue;

            startx = PNG_PASS_START_COL(pass) * channels;
            stepx = PNG_PASS_COL_OFFSET(pass) * channels;
            y = PNG_PASS_START_ROW(pass);
            stepy = PNG_PASS_ROW_OFFSET(pass);
         }

         else
         {
            y = 0;
            startx = 0;
            stepx = channels;
            stepy = 1;
         }

         for (; y<height; y += stepy)
         {
            png_bytep inrow = png_voidcast(png_bytep, display->local_row);
            png_bytep outrow;
            png_const_bytep end_row;

            /* Read the row, which is packed: */
            png_read_row(png_ptr, inrow, NULL);

            outrow = png_voidcast(png_bytep, display->first_row);
            outrow += y * step_row;
            end_row = outrow + width * channels;

            /* Now do the composition on each pixel in this row. */
            outrow += startx;
            for (; outrow < end_row; outrow += stepx)
            {
               png_byte alpha = inrow[channels];

               if (alpha > 0) /* else no change to the output */
               {
                  unsigned int c;

                  for (c=0; c<channels; ++c)
                  {
                     png_uint_32 component = inrow[c];

                     if (alpha < 255) /* else just use component */
                     {
                        /* This is PNG_OPTIMIZED_ALPHA, the component value
                         * is a linear 8-bit value.  Combine this with the
                         * current outrow[c] value which is sRGB encoded.
                         * Arithmetic here is 16-bits to preserve the output
                         * values correctly.
                         */
                        component *= 257*255; /* =65535 */
                        component += (255-alpha)*png_sRGB_table[outrow[c]];

                        /* So 'component' is scaled by 255*65535 and is
                         * therefore appropriate for the sRGB to linear
                         * conversion table.
                         */
                        component = PNG_sRGB_FROM_LINEAR(component);
                     }

                     outrow[c] = (png_byte)component;
                  }
               }

               inrow += channels+1; /* components and alpha channel */
            }
         }
      }
   }

   return 1;
}